

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator * __thiscall
QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
emplace_helper<std::pair<unsigned_int,QMetaObject_const*>>
          (iterator *__return_storage_ptr__,
          QMultiHash<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *this,QObject **key,
          pair<unsigned_int,_const_QMetaObject_*> *args)

{
  piter it;
  MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *n;
  long in_FS_OFFSET;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>>::
  findOrInsert<QObject*>
            ((InsertionResult *)local_48,
             *(Data<QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>> **
              )this,key);
  n = (MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_> *)
      ((*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].entries +
      (*(Span **)(local_48._0_8_ + 0x20))[(ulong)local_48._8_8_ >> 7].offsets
      [(uint)local_48._8_8_ & 0x7f]);
  if (local_48[0x10] == false) {
    QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
    createInPlace<std::pair<unsigned_int,QMetaObject_const*>>(n,key,args);
  }
  else {
    QHashPrivate::MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>>::
    insertMulti<std::pair<unsigned_int,QMetaObject_const*>>
              ((MultiNode<QObject*,std::pair<unsigned_int,QMetaObject_const*>> *)n,args);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  it.bucket = local_48._8_8_;
  it.d = (Data<QHashPrivate::MultiNode<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>_> *
         )local_48._0_8_;
  QMultiHash<QObject_*,_std::pair<unsigned_int,_const_QMetaObject_*>_>::iterator::iterator
            (__return_storage_ptr__,it,(Chain **)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }